

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::internal::CmpHelperOpFailure<std::variant<int,float,std::__cxx11::string>,int>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expr1,char *expr2,char *op,
          variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *val1,int *val2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  char *local_238;
  char *local_230;
  internal *local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  AssertionResult local_1e0;
  anon_class_8_1_3fcf66a2 local_1b8;
  undefined1 local_1b0 [392];
  
  paVar1 = &local_1e0.m_message.field_2;
  local_1e0.m_message._M_string_length = 0;
  local_1e0.m_message.field_2._M_local_buf[0] = '\0';
  local_1e0.m_result = false;
  local_238 = expr2;
  local_230 = expr1;
  local_228 = this;
  local_1e0.m_message._M_dataplus._M_p = (pointer)paVar1;
  pAVar3 = AssertionResult::operator<<(&local_1e0,(char (*) [18])"error: Expected: ");
  pAVar3 = AssertionResult::operator<<(pAVar3,(char **)&local_228);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x140649);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_238);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x140649);
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_230);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  local_220._M_dataplus._M_p = local_1b0 + 0x10;
  local_1b8.os = (iu_ostream **)&local_220;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/../include/gtest/../internal/../internal/../iutest_printers.hpp:512:22)_&&,_const_std::variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
    ::_S_vtable._M_arr[(byte)op[0x20]]._M_data)
            (&local_1b8,
             (variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)op);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_200);
  pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [5])" vs ");
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b0);
  std::ostream::operator<<
            (local_1b0 + 0x10,
             *(int *)&(val1->
                      super__Variant_base<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).super__Move_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
                      super__Copy_assign_alias<int,_float,_std::__cxx11::basic_string<char>_>.
                      super__Move_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
                      super__Copy_ctor_alias<int,_float,_std::__cxx11::basic_string<char>_>.
                      super__Variant_storage_alias<int,_float,_std::__cxx11::basic_string<char>_>.
                      _M_u);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  pAVar3 = AssertionResult::operator<<(pAVar3,&local_220);
  (__return_storage_ptr__->m_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_message).field_2;
  pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length);
  __return_storage_ptr__->m_result = pAVar3->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.m_message._M_dataplus._M_p,
                    CONCAT71(local_1e0.m_message.field_2._M_allocated_capacity._1_7_,
                             local_1e0.m_message.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2, const char* op
    , const T1& val1, const T2& val2)
{
    return AssertionFailure() << "error: Expected: " << expr1 << " " << op << " " << expr2
        << "\n  Actual: " << FormatForComparisonFailureMessage(val1, val2)
        << " vs " << FormatForComparisonFailureMessage(val2, val1);
}